

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_u32le(CBS *cbs,uint32_t *out)

{
  ulong uVar1;
  uint8_t *puVar2;
  uint in_EDX;
  long lVar3;
  
  uVar1 = cbs->len;
  if (3 < uVar1) {
    puVar2 = cbs->data;
    cbs->data = puVar2 + 4;
    cbs->len = uVar1 - 4;
    lVar3 = 0;
    in_EDX = 0;
    do {
      in_EDX = (uint)puVar2[lVar3] | in_EDX << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  if (3 < uVar1) {
    *out = in_EDX >> 0x18 | (in_EDX & 0xff0000) >> 8 | (in_EDX & 0xff00) << 8 | in_EDX << 0x18;
  }
  return (uint)(3 < uVar1);
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}